

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall QPDF::JSONReactor::~JSONReactor(JSONReactor *this)

{
  JSONReactor *this_local;
  
  (this->super_Reactor)._vptr_Reactor = (_func_int **)&PTR__JSONReactor_0058e948;
  QPDFObjectHandle::~QPDFObjectHandle(&this->next_obj);
  std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
  ~vector(&this->stack);
  std::__cxx11::string::~string((string *)&this->cur_object);
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::~shared_ptr(&this->descr);
  std::shared_ptr<InputSource>::~shared_ptr(&this->is);
  JSON::Reactor::~Reactor(&this->super_Reactor);
  return;
}

Assistant:

~JSONReactor() override = default;